

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inTop(Tokenizer *this,char ch)

{
  char ch_local;
  Tokenizer *this_local;
  
  switch(ch) {
  case '(':
    this->string_depth = 1;
    this->state = st_in_string;
    break;
  case ')':
    this->type = tt_bad;
    QTC::TC("qpdf","QPDFTokenizer bad )",0);
    std::__cxx11::string::operator=((string *)&this->error_message,"unexpected )");
    this->state = st_token_ready;
    break;
  default:
    this->state = st_literal;
    break;
  case '+':
  case '-':
    this->state = st_sign;
    break;
  case '.':
    this->state = st_decimal;
    break;
  case '/':
    this->state = st_name;
    std::__cxx11::string::operator+=((string *)&this->val,ch);
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    this->state = st_number;
    break;
  case '<':
    this->state = st_lt;
    break;
  case '>':
    this->state = st_gt;
    break;
  case '[':
    this->type = tt_array_open;
    this->state = st_token_ready;
    break;
  case ']':
    this->type = tt_array_close;
    this->state = st_token_ready;
    break;
  case '{':
    this->type = tt_brace_open;
    this->state = st_token_ready;
    break;
  case '}':
    this->type = tt_brace_close;
    this->state = st_token_ready;
  }
  return;
}

Assistant:

void
Tokenizer::inTop(char ch)
{
    switch (ch) {
    case '(':
        string_depth = 1;
        state = st_in_string;
        return;

    case '<':
        state = st_lt;
        return;

    case '>':
        state = st_gt;
        return;

    case (')'):
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad )");
        error_message = "unexpected )";
        state = st_token_ready;
        return;

    case '[':
        type = tt::tt_array_open;
        state = st_token_ready;
        return;

    case ']':
        type = tt::tt_array_close;
        state = st_token_ready;
        return;

    case '{':
        type = tt::tt_brace_open;
        state = st_token_ready;
        return;

    case '}':
        type = tt::tt_brace_close;
        state = st_token_ready;
        return;

    case '/':
        state = st_name;
        val += ch;
        return;

    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
        state = st_number;
        return;

    case '+':
    case '-':
        state = st_sign;
        return;

    case '.':
        state = st_decimal;
        return;

    default:
        state = st_literal;
        return;
    }
}